

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O1

void VP8LHuffmanTablesDeallocate(HuffmanTables *huffman_tables)

{
  HuffmanTablesSegment *ptr;
  HuffmanTablesSegment *pHVar1;
  
  if (huffman_tables != (HuffmanTables *)0x0) {
    ptr = (huffman_tables->root).next;
    WebPSafeFree((huffman_tables->root).start);
    (huffman_tables->root).start = (HuffmanCode *)0x0;
    (huffman_tables->root).next = (HuffmanTablesSegment *)0x0;
    while (ptr != (HuffmanTablesSegment *)0x0) {
      pHVar1 = ptr->next;
      WebPSafeFree(ptr->start);
      WebPSafeFree(ptr);
      ptr = pHVar1;
    }
  }
  return;
}

Assistant:

void VP8LHuffmanTablesDeallocate(HuffmanTables* const huffman_tables) {
  HuffmanTablesSegment *current, *next;
  if (huffman_tables == NULL) return;
  // Free the root node.
  current = &huffman_tables->root;
  next = current->next;
  WebPSafeFree(current->start);
  current->start = NULL;
  current->next = NULL;
  current = next;
  // Free the following nodes.
  while (current != NULL) {
    next = current->next;
    WebPSafeFree(current->start);
    WebPSafeFree(current);
    current = next;
  }
}